

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halftest.cpp
# Opt level: O3

int testround(float val)

{
  float fVar1;
  uint16_t uVar2;
  float fVar3;
  
  uVar2 = Ptex::v2_4::PtexHalf::fromFloat(val);
  fVar1 = (float)(&Ptex::v2_4::PtexHalf::h2fTable)[(ulong)(uVar2 - 1) & 0xffff];
  fVar3 = ABS((float)(&Ptex::v2_4::PtexHalf::h2fTable)[uVar2] - val);
  if ((fVar3 <= ABS(fVar1 - val)) &&
     (fVar1 = (float)(&Ptex::v2_4::PtexHalf::h2fTable)[(ulong)(uVar2 + 1) & 0xffff],
     fVar3 <= ABS(fVar1 - val))) {
    return 0;
  }
  printf("error: %g->0x%x->%g, expected ->0x%x->%g\n",SUB84((double)val,0),
         (double)(float)(&Ptex::v2_4::PtexHalf::h2fTable)[uVar2],(double)fVar1);
  return 1;
}

Assistant:

int testround(float val)
{
    int i = f2h(val);
    float f = fabs(h2f(i)-val);
    float f1 = fabs(h2f(i-1)-val);
    float f2 = fabs(h2f(i+1)-val);
    if (f1 < f) {
        printf("error: %g->0x%x->%g, expected ->0x%x->%g\n",
               val, i, h2f(i), i-1, h2f(i-1));
        return 1;
    }
    if (f2 < f) {
        printf("error: %g->0x%x->%g, expected ->0x%x->%g\n",
               val, i, h2f(i), i+1, h2f(i+1));
        return 1;
    }
    return 0;
}